

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
duckdb::AlterViewInfo::Deserialize(Deserializer *deserializer)

{
  AlterViewType AVar1;
  SerializationException *this;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_> in_RDI;
  unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true> result;
  AlterViewType alter_view_type;
  string *in_stack_ffffffffffffff78;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
  *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  allocator *paVar2;
  allocator local_59;
  string local_58 [16];
  Deserializer *in_stack_ffffffffffffffb8;
  
  AVar1 = Deserializer::ReadProperty<duckdb::AlterViewType>
                    ((Deserializer *)
                     in_RDI._M_t.
                     super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
                     .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl,
                     (field_id_t)((ulong)in_stack_ffffffffffffff88 >> 0x30),
                     (char *)in_stack_ffffffffffffff80);
  unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true> *)
             0xae2c65);
  if (AVar1 == RENAME_VIEW) {
    RenameViewInfo::Deserialize(in_stack_ffffffffffffffb8);
    unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>::operator=
              ((unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>
                *)in_stack_ffffffffffffff80,
               (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>
                *)in_stack_ffffffffffffff78);
    unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>
                *)0xae2c99);
    unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>,true>::
    unique_ptr<duckdb::AlterViewInfo,std::default_delete<std::unique_ptr<duckdb::AlterInfo,std::default_delete<duckdb::AlterInfo>>>,void>
              (in_stack_ffffffffffffff80,
               (unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>_> *)
               in_stack_ffffffffffffff78);
    unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>::~unique_ptr
              ((unique_ptr<duckdb::AlterViewInfo,_std::default_delete<duckdb::AlterViewInfo>,_true>
                *)0xae2d7f);
    return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
           (__uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
           in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
           super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
  }
  this = (SerializationException *)__cxa_allocate_exception(0x10);
  paVar2 = &local_59;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_58,"Unsupported type for deserialization of AlterViewInfo!",paVar2);
  SerializationException::SerializationException(this,in_stack_ffffffffffffff78);
  __cxa_throw(this,&SerializationException::typeinfo,SerializationException::~SerializationException
             );
}

Assistant:

unique_ptr<AlterInfo> AlterViewInfo::Deserialize(Deserializer &deserializer) {
	auto alter_view_type = deserializer.ReadProperty<AlterViewType>(300, "alter_view_type");
	unique_ptr<AlterViewInfo> result;
	switch (alter_view_type) {
	case AlterViewType::RENAME_VIEW:
		result = RenameViewInfo::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of AlterViewInfo!");
	}
	return std::move(result);
}